

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

token * __thiscall libchars::commands::find_flag(commands *this,char *name)

{
  int iVar1;
  token *ptVar2;
  
  ptVar2 = this->t_par;
  if (ptVar2 != (token *)0x0 && (this->cmd != (command *)0x0 && name != (char *)0x0)) {
    do {
      iVar1 = std::__cxx11::string::compare((char *)&ptVar2->name);
      if ((iVar1 == 0) && (ptVar2->ttype == FLAG)) {
        return ptVar2;
      }
      ptVar2 = ptVar2->next;
    } while (ptVar2 != (token *)0x0);
  }
  return (token *)0x0;
}

Assistant:

token *commands::find_flag(const char *name)
    {
        if (name == NULL)
            return NULL;
        if (cmd == NULL)
            return NULL;

        token *T = t_par;
        while (T != NULL && (T->name != name || T->ttype != token::FLAG))
            T = T->next;

        return T;
    }